

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O0

bool __thiscall server::QServ::handleTextCommands(QServ *this,clientinfo *ci,char *text)

{
  bool bVar1;
  int commandid;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  bool local_8ed;
  int local_8ec;
  char local_8e8 [3];
  bool fargs;
  int j;
  char fulltext [1024];
  char *pcStack_4d8;
  int command;
  char *token;
  char *pcStack_4c8;
  int argc;
  char *args [20];
  char ftb [1024];
  char *text_local;
  clientinfo *ci_local;
  QServ *this_local;
  
  setSender(this,ci->clientnum);
  setlastCI(this,ci);
  memset(args + 0x13,0,0x400);
  sprintf((char *)(args + 0x13),"%s",text);
  setFullText(this,(char *)(args + 0x13));
  bVar1 = isCommand(this,text);
  if (bVar1) {
    token._4_4_ = 0;
    pcStack_4d8 = strtok(text," ");
    while (pcStack_4d8 != (char *)0x0) {
      args[(long)token._4_4_ + -1] = pcStack_4d8;
      pcStack_4d8 = strtok((char *)0x0," ");
      token._4_4_ = token._4_4_ + 1;
    }
    commandid = getCommand(this,(char *)0x0,&stack0xfffffffffffffb38);
    pcVar4 = colorname(ci);
    pcVar5 = getFullText(this);
    out(2,"%s issued: %s",pcVar4,pcVar5);
    if (commandid < 0) {
      sendf(ci->clientnum,1,"ris",0x23,
            "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.");
    }
    else {
      for (local_8ec = 0; sVar6 = strlen((char *)(args + 0x13)), (ulong)(long)local_8ec <= sVar6;
          local_8ec = local_8ec + 1) {
        sVar6 = strlen(pcStack_4c8);
        local_8e8[local_8ec] = *(char *)((long)args + (long)local_8ec + sVar6 + 0x99);
      }
      setFullText(this,local_8e8);
      iVar3 = ci->privilege;
      iVar2 = getCommandPriv(this,commandid);
      if (iVar3 < iVar2) {
        sendf(ci->clientnum,1,"ris",0x23,"\f3Insufficient permission");
      }
      else {
        bVar1 = commandHasArgs(this,commandid);
        if (bVar1) {
          iVar3 = getCommandArgCount(this,commandid);
          local_8ed = iVar3 == token._4_4_;
        }
        else {
          local_8ed = true;
        }
        setlastSA(this,local_8ed);
        exeCommand(this,commandid,&stack0xfffffffffffffb38,token._4_4_);
      }
    }
  }
  else {
    sVar6 = strlen((char *)(args + 0x13));
    if ((sVar6 < 0x400) && (bVar1 = ircBot::isConnected(&irc), bVar1)) {
      ircBot::speak(&irc,"%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,args + 0x13);
      printf("%s(%d): %s\r\n",ci->name,(ulong)(uint)ci->clientnum,args + 0x13);
    }
  }
  return false;
}

Assistant:

bool QServ::handleTextCommands(clientinfo *ci, char *text) {
        setSender(ci->clientnum);
        setlastCI(ci);
        
        char ftb[1024] = {0};
        
        sprintf(ftb, "%s", text);
        setFullText(ftb);
        
        if(isCommand(text)) {
            char *args[20];
            
            
            int argc = 0;
            char *token = 0;
            
            token = strtok(text, " ");
            while(token != NULL) {
                args[argc] = token;
                token = strtok(NULL, " ");
                argc++;
            }
            
            int command = getCommand(0, args);
            out(ECHO_CONSOLE, "%s issued: %s",colorname(ci), getFullText());
            if(command >= 0) {
                
                char fulltext[1024];
                for(int j = 0; j <= strlen(ftb); j++) {
                    fulltext[j] = ftb[j+strlen(args[0])+1];
                }
                setFullText(fulltext);
                
                bool fargs = false;
                if(ci->privilege >= getCommandPriv(command)) {
                    if(commandHasArgs(command)) {
                        if(getCommandArgCount(command) == argc) {
                            fargs = true;
                        } else {
                            fargs = false;
                        }
                    } else {
                        fargs = true;
                    }
                    
                    setlastSA(fargs);
                    exeCommand(command, args, argc);
                    return false;
                } else {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Insufficient permission");
                    return false;
                }
            } else {
                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Command not found. Use \f2\"#help\" \f3for a list of commands.");
                return false;
            }
        } else {
            
            if(strlen(ftb) < 1024 && irc.isConnected()) {
                irc.speak("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
                printf("%s(%d): %s\r\n", ci->name, ci->clientnum, ftb);
            } else {
                //disconnect_client(ci->clientnum, DISC_OVERFLOW);
            }
            //checkoLang(ci->clientnum, text);
        }
        //memset(ftb,'\0',1000);
        
        return false;
    }